

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O2

int tnt_schema_add_indexes(tnt_schema *schema_obj,tnt_reply *r)

{
  byte bVar1;
  mh_assoc_t *pmVar2;
  byte *pbVar3;
  void *pvVar4;
  int iVar5;
  mh_int_t mVar6;
  uint64_t uVar7;
  tnt_schema_ival *val;
  char *__src;
  char *__dest;
  assoc_val *ptr;
  int iVar8;
  uint32_t *arg;
  void *arg_00;
  assoc_val ***ret;
  assoc_val ***ret_00;
  uint uVar9;
  bool bVar10;
  assoc_key local_70;
  assoc_val *local_60;
  assoc_val *local_58;
  mh_assoc_t *local_50;
  undefined4 local_44;
  byte *pbStack_40;
  uint32_t space_number;
  byte *local_38;
  char *tuple;
  
  pmVar2 = schema_obj->space_hash;
  local_38 = (byte *)r->data;
  iVar5 = mp_check((char **)&local_38,r->data_end);
  iVar8 = -1;
  if (iVar5 == 0) {
    pbVar3 = (byte *)r->data;
    bVar1 = *pbVar3;
    if (mp_type_hint[bVar1] == MP_ARRAY) {
      local_38 = pbVar3 + 1;
      local_50 = pmVar2;
      if ((bVar1 & 0x40) == 0) {
        uVar9 = bVar1 & 0xf;
      }
      else if ((bVar1 & 1) == 0) {
        local_38 = pbVar3 + 3;
        uVar9 = (uint)(ushort)(*(ushort *)(pbVar3 + 1) << 8 | *(ushort *)(pbVar3 + 1) >> 8);
      }
      else {
        uVar9 = *(uint *)(pbVar3 + 1);
        uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        local_38 = pbVar3 + 5;
      }
      while( true ) {
        pmVar2 = local_50;
        bVar10 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar10) break;
        pbStack_40 = local_38;
        bVar1 = *local_38;
        if (mp_type_hint[bVar1] != MP_ARRAY) {
LAB_0010dcb3:
          ptr = (assoc_val *)0x0;
          val = (tnt_schema_ival *)0x0;
LAB_0010dcb9:
          mp_next((char **)&local_38);
          if (ptr != (assoc_val *)0x0) {
            tnt_mem_free(ptr);
          }
          tnt_schema_ival_free(val);
          return -1;
        }
        if ((bVar1 & 0x40) == 0) {
          pbStack_40 = local_38 + 1;
        }
        else {
          pbStack_40 = local_38 + (ulong)(bVar1 & 1) * 2 + 3;
        }
        uVar7 = mp_decode_uint((char **)&stack0xffffffffffffffc0);
        local_44 = (undefined4)uVar7;
        if (mp_type_hint[*pbStack_40] != MP_UINT) goto LAB_0010dcb3;
        local_70.id = (char *)&local_44;
        local_70.id_len = 4;
        mVar6 = mh_assoc_find(pmVar2,&local_70,arg_00);
        if (mVar6 == pmVar2->n_buckets) {
          return -1;
        }
        pvVar4 = pmVar2->p[mVar6]->data;
        val = (tnt_schema_ival *)tnt_mem_alloc(0x10);
        if (val == (tnt_schema_ival *)0x0) goto LAB_0010dcb3;
        val->name = (char *)0x0;
        val->name_len = 0;
        val->number = 0;
        if (mp_type_hint[*pbStack_40] != MP_UINT) {
LAB_0010dcae:
          ptr = (assoc_val *)0x0;
          goto LAB_0010dcb9;
        }
        uVar7 = mp_decode_uint((char **)&stack0xffffffffffffffc0);
        val->number = (uint32_t)uVar7;
        if (mp_type_hint[*pbStack_40] != MP_STR) goto LAB_0010dcae;
        __src = mp_decode_str((char **)&stack0xffffffffffffffc0,&val->name_len);
        __dest = (char *)tnt_mem_alloc((ulong)val->name_len);
        val->name = __dest;
        if (__dest == (char *)0x0) goto LAB_0010dcae;
        memcpy(__dest,__src,(ulong)val->name_len);
        ptr = (assoc_val *)tnt_mem_alloc(0x18);
        local_58 = ptr;
        if (ptr == (assoc_val *)0x0) goto LAB_0010dcae;
        (ptr->key).id = val->name;
        (ptr->key).id_len = val->name_len;
        ptr->data = val;
        local_60 = (assoc_val *)tnt_mem_alloc(0x18);
        if (local_60 == (assoc_val *)0x0) goto LAB_0010dcb9;
        arg = &val->number;
        (local_60->key).id = (char *)arg;
        (local_60->key).id_len = 4;
        local_60->data = val;
        mh_assoc_put(*(mh_assoc_t **)((long)pvVar4 + 0x10),&local_58,ret,arg);
        mh_assoc_put(*(mh_assoc_t **)((long)pvVar4 + 0x10),&local_60,ret_00,arg);
        mp_next((char **)&local_38);
      }
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int tnt_schema_add_indexes(struct tnt_schema *schema_obj, struct tnt_reply *r) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	const char *tuple = r->data;
	if (mp_check(&tuple, tuple + (r->data_end - r->data)))
		return -1;
	tuple = r->data;
	if (mp_typeof(*tuple) != MP_ARRAY)
		return -1;
	uint32_t space_count = mp_decode_array(&tuple);
	while (space_count-- > 0) {
		if (tnt_schema_add_index(schema, &tuple))
			return -1;
	}
	return 0;
}